

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpauseanimation.cpp
# Opt level: O0

void QPauseAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  QPauseAnimation *in_RDI;
  long in_FS_OFFSET;
  QBindable<int> QVar5;
  void *_v_1;
  void *_v;
  QPauseAnimation *_t;
  QUntypedPropertyData *local_18;
  QBindableInterface *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 1) && (piVar2 = (int *)*in_RCX, in_EDX == 0)) {
    iVar4 = (*(in_RDI->super_QAbstractAnimation).super_QObject._vptr_QObject[0xc])();
    *piVar2 = iVar4;
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setDuration((QPauseAnimation *)0x200000000,(int)((ulong)in_RCX >> 0x20));
  }
  if ((in_ESI == 8) && (in_EDX == 0)) {
    QVar5 = bindableDuration(in_RDI);
    puVar3 = (undefined8 *)*in_RCX;
    local_18 = QVar5.super_QUntypedBindable.data;
    *puVar3 = local_18;
    local_10 = QVar5.super_QUntypedBindable.iface;
    puVar3[1] = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPauseAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPauseAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        default: break;
        }
    }
}